

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParsePubidLiteral(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  bool bVar4;
  bool bVar5;
  htmlParserCtxtPtr local_38;
  xmlChar *ret;
  int quote;
  int err;
  size_t startPosition;
  size_t len;
  htmlParserCtxtPtr ctxt_local;
  
  startPosition = 0;
  bVar4 = false;
  local_38 = (htmlParserCtxtPtr)0x0;
  if ((*ctxt->input->cur == '\"') || (*ctxt->input->cur == '\'')) {
    xVar1 = *ctxt->input->cur;
    xmlNextChar(ctxt);
    if (ctxt->input->cur < ctxt->input->base) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      pxVar2 = ctxt->input->cur;
      pxVar3 = ctxt->input->base;
      while( true ) {
        bVar5 = false;
        if (*ctxt->input->cur != '\0') {
          bVar5 = *ctxt->input->cur != xVar1;
        }
        if (!bVar5) break;
        if (""[(int)(uint)*ctxt->input->cur] == '\0') {
          htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"Invalid char in PubidLiteral 0x%X\n",
                          (uint)*ctxt->input->cur);
          bVar4 = true;
        }
        startPosition = startPosition + 1;
        xmlNextChar(ctxt);
      }
      if (*ctxt->input->cur == '\"') {
        xmlNextChar(ctxt);
        if (!bVar4) {
          local_38 = (htmlParserCtxtPtr)
                     xmlStrndup(ctxt->input->base + ((long)pxVar2 - (long)pxVar3),(int)startPosition
                               );
        }
      }
      else {
        htmlParseErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,"Unfinished PubidLiteral\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
      }
      ctxt_local = local_38;
    }
  }
  else {
    htmlParseErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,"PubidLiteral \" or \' expected\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
htmlParsePubidLiteral(htmlParserCtxtPtr ctxt) {
    size_t len = 0, startPosition = 0;
    int err = 0;
    int quote;
    xmlChar *ret = NULL;

    if ((CUR != '"') && (CUR != '\'')) {
	htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_STARTED,
	             "PubidLiteral \" or ' expected\n", NULL, NULL);
        return(NULL);
    }
    quote = CUR;
    NEXT;

    /*
     * Name ::= (Letter | '_') (NameChar)*
     */
    if (CUR_PTR < BASE_PTR)
        return(ret);
    startPosition = CUR_PTR - BASE_PTR;

    while ((CUR != 0) && (CUR != quote)) {
        if (!IS_PUBIDCHAR_CH(CUR)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in PubidLiteral 0x%X\n", CUR);
            err = 1;
        }
        len++;
        NEXT;
    }

    if (CUR != '"') {
        htmlParseErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED,
                     "Unfinished PubidLiteral\n", NULL, NULL);
    } else {
        NEXT;
        if (err == 0)
            ret = xmlStrndup((BASE_PTR + startPosition), len);
    }

    return(ret);
}